

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

void __thiscall ON_Quaternion::SetRotation(ON_Quaternion *this,ON_Plane *plane0,ON_Plane *plane1)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  int local_a0;
  int local_88;
  int k;
  int j;
  int i;
  double *q;
  double s;
  double r;
  double m [3] [3];
  ON_Plane *plane1_local;
  ON_Plane *plane0_local;
  ON_Quaternion *this_local;
  
  m[2][2] = (double)plane1;
  dVar5 = (plane1->zaxis).x * (plane0->zaxis).x +
          (plane1->xaxis).x * (plane0->xaxis).x + (plane1->yaxis).x * (plane0->yaxis).x;
  m[0][0] = (plane1->zaxis).x * (plane0->zaxis).y +
            (plane1->xaxis).x * (plane0->xaxis).y + (plane1->yaxis).x * (plane0->yaxis).y;
  m[0][1] = (plane1->zaxis).x * (plane0->zaxis).z +
            (plane1->xaxis).x * (plane0->xaxis).z + (plane1->yaxis).x * (plane0->yaxis).z;
  m[0][2] = (plane1->zaxis).y * (plane0->zaxis).x +
            (plane1->xaxis).y * (plane0->xaxis).x + (plane1->yaxis).y * (plane0->yaxis).x;
  m[1][0] = (plane1->zaxis).y * (plane0->zaxis).y +
            (plane1->xaxis).y * (plane0->xaxis).y + (plane1->yaxis).y * (plane0->yaxis).y;
  m[1][1] = (plane1->zaxis).y * (plane0->zaxis).z +
            (plane1->xaxis).y * (plane0->xaxis).z + (plane1->yaxis).y * (plane0->yaxis).z;
  m[1][2] = (plane1->zaxis).z * (plane0->zaxis).x +
            (plane1->xaxis).z * (plane0->xaxis).x + (plane1->yaxis).z * (plane0->yaxis).x;
  m[2][0] = (plane1->zaxis).z * (plane0->zaxis).y +
            (plane1->xaxis).z * (plane0->xaxis).y + (plane1->yaxis).z * (plane0->yaxis).y;
  m[2][1] = (plane1->zaxis).z * (plane0->zaxis).z +
            (plane1->xaxis).z * (plane0->xaxis).z + (plane1->yaxis).z * (plane0->yaxis).z;
  bVar2 = true;
  k = 0;
  do {
    bVar1 = false;
    if (k < 3) {
      bVar1 = bVar2;
    }
    if (!bVar1) {
      if (bVar2) {
        this->a = 1.0;
        this->d = 0.0;
        this->c = 0.0;
        this->b = 0.0;
      }
      else {
        if (dVar5 < m[1][0]) {
          local_a0 = 2;
          if (m[2][1] <= m[1][0]) {
            local_a0 = 1;
          }
        }
        else {
          local_a0 = 2;
          if (m[2][1] <= dVar5) {
            local_a0 = 0;
          }
        }
        uVar3 = (local_a0 + 1U) % 3;
        uVar4 = (local_a0 + 2U) % 3;
        dVar5 = ((m[(long)local_a0 + -1][(long)local_a0 + 2] + 1.0) -
                m[(long)(int)uVar3 + -1][(long)(int)uVar3 + 2]) -
                m[(long)(int)uVar4 + -1][(long)(int)uVar4 + 2];
        if (dVar5 <= 2.2250738585072014e-308) {
          if (dVar5 < -1e-14) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_quaternion.cpp"
                       ,0xea,"","noisy rotation matrix");
          }
          this->a = 1.0;
          this->d = 0.0;
          this->c = 0.0;
          this->b = 0.0;
        }
        else {
          dVar5 = sqrt(dVar5);
          dVar6 = 0.5 / dVar5;
          this->a = dVar6 * (m[(long)(int)uVar4 + -1][(long)(int)uVar3 + 2] -
                            m[(long)(int)uVar3 + -1][(long)(int)uVar4 + 2]);
          (&this->b)[local_a0] = dVar5 * 0.5;
          (&this->b)[(int)uVar3] =
               dVar6 * (m[(long)local_a0 + -1][(long)(int)uVar3 + 2] +
                       m[(long)(int)uVar3 + -1][(long)local_a0 + 2]);
          (&this->b)[(int)uVar4] =
               dVar6 * (m[(long)(int)uVar4 + -1][(long)local_a0 + 2] +
                       m[(long)local_a0 + -1][(long)(int)uVar4 + 2]);
        }
      }
      return;
    }
    for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
      if (k == local_88) {
        if (1.490116119385e-08 < ABS(m[(long)k + -1][(long)k + 2] - 1.0)) {
          bVar2 = false;
          break;
        }
      }
      else if (1.490116119385e-08 < ABS(m[(long)k + -1][(long)local_88 + 2])) {
        bVar2 = false;
        break;
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

void ON_Quaternion::SetRotation(const ON_Plane& plane0, const ON_Plane& plane1 )
{
  double m[3][3], r, s;
  double* q;
  int i,j,k;

  // set m[][] = rotation matrix (acting on the left)
  m[0][0] = plane1.xaxis.x*plane0.xaxis.x
          + plane1.yaxis.x*plane0.yaxis.x
          + plane1.zaxis.x*plane0.zaxis.x;
  m[0][1] = plane1.xaxis.x*plane0.xaxis.y
          + plane1.yaxis.x*plane0.yaxis.y
          + plane1.zaxis.x*plane0.zaxis.y;
  m[0][2] = plane1.xaxis.x*plane0.xaxis.z
          + plane1.yaxis.x*plane0.yaxis.z
          + plane1.zaxis.x*plane0.zaxis.z;
  m[1][0] = plane1.xaxis.y*plane0.xaxis.x
          + plane1.yaxis.y*plane0.yaxis.x
          + plane1.zaxis.y*plane0.zaxis.x;
  m[1][1] = plane1.xaxis.y*plane0.xaxis.y
          + plane1.yaxis.y*plane0.yaxis.y
          + plane1.zaxis.y*plane0.zaxis.y;
  m[1][2] = plane1.xaxis.y*plane0.xaxis.z
          + plane1.yaxis.y*plane0.yaxis.z
          + plane1.zaxis.y*plane0.zaxis.z;
  m[2][0] = plane1.xaxis.z*plane0.xaxis.x
          + plane1.yaxis.z*plane0.yaxis.x
          + plane1.zaxis.z*plane0.zaxis.x;
  m[2][1] = plane1.xaxis.z*plane0.xaxis.y
          + plane1.yaxis.z*plane0.yaxis.y
          + plane1.zaxis.z*plane0.zaxis.y;
  m[2][2] = plane1.xaxis.z*plane0.xaxis.z
          + plane1.yaxis.z*plane0.yaxis.z
          + plane1.zaxis.z*plane0.zaxis.z;

  k = 1;
  s = ON_SQRT_EPSILON;
  for ( i = 0; i < 3 && k; i++ ) for ( j = 0; j < 3; j++ )
  {
    if ( i == j )
    {
      if (fabs(m[i][i]-1.0) > s )
      {
        k = 0;
        break;
      }
    }
    else
    {
      if (fabs(m[i][j]) > s )
      {
        k = 0;
        break;
      }
    }
  }

  if ( k )
  {
    // m[][] is the identity matrix
    a = 1.0;
    b = c = d = 0.0;
    return;
  }

  i = (m[0][0] >= m[1][1]) 
    ? ((m[0][0] >= m[2][2])?0:2) 
    : ((m[1][1] >= m[2][2])?1:2);
  j = (i+1)%3;
  k = (i+2)%3;

  // Note: 
  //   For any rotation matrix, the diagonal is
  //     x^2(1-cos(t)) + cos(t), y^2(1-cos(t)) + cos(t), z^2(1-cos(t)) + cos(t),
  //   where (x,y,z) is the unit vector axis of rotation and "t" is the angle.
  //   So the trace = 1 + 2cos(t).
  //
  //   When cos(t) >= 0, m[i][i] corresponds to the axis component that has
  //   the largest absolute value.
  //
  //   
  //
  //   Observe that 
  //     s = 1 + m[i][i] - m[j][j] - m[k][k]
  //       = 1 + 2*m[i][i] - m[i][i] - m[j][j] - m[k][k]
  //       = 1 + 2*m[i][i] - trace
  //       = 2*(m[i][i] - cos(t))
  //       = 2*(w^2(1-cos(t)^2) + cos(t) - cos(t))
  //       = 2*w*w*(sin(t)^2)
  //
  //    When cos(t) >= 0, m[i][i] corresponds to the coordinate of
  //    the rotation axis with largest absolute value.


  s = 1.0 + m[i][i] - m[j][j] - m[k][k];
  if ( s > ON_DBL_MIN )
  {
    r = sqrt(s);
    s = 0.5/r;
    a = s*(m[k][j] - m[j][k]);
    q = &b;
    q[i] = 0.5*r;
    q[j] = s*(m[i][j] + m[j][i]);
    q[k] = s*(m[k][i] + m[i][k]);
  }
  else
  {
    if ( s < -1.0e-14 )
      ON_ERROR("noisy rotation matrix");
    a = 1.0;
    b = c = d = 0.0;
  }
}